

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

bool __thiscall
node::BlockManager::ReadBlockFromDisk(BlockManager *this,CBlock *block,FlatFilePos *pos)

{
  long lVar1;
  uint256 hash;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  uchar uVar2;
  bool bVar3;
  TransactionSerParams *flag;
  Params *pPVar4;
  size_t in_RDX;
  char *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  ParamsWrapper<TransactionSerParams,_CBlock> PVar5;
  exception *e;
  AutoFile filein;
  BlockManager *in_stack_fffffffffffffda8;
  CBlock *in_stack_fffffffffffffdb0;
  AutoFile *in_stack_fffffffffffffdb8;
  char *in_stack_fffffffffffffdc0;
  CBlockHeader *in_stack_fffffffffffffdc8;
  Params *in_stack_fffffffffffffdd0;
  uint in_stack_fffffffffffffddc;
  undefined8 in_stack_fffffffffffffde8;
  undefined1 fReadOnly;
  FlatFilePos *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  LogFlags in_stack_fffffffffffffe10;
  undefined4 uVar6;
  int source_line;
  undefined1 *puVar7;
  undefined7 in_stack_fffffffffffffe28;
  ConstevalFormatString<2U> in_stack_fffffffffffffe58;
  char *fmt;
  string_view in_stack_fffffffffffffe60;
  bool local_171;
  Params *in_stack_fffffffffffffed8;
  CBlock *in_stack_fffffffffffffee0;
  undefined1 local_d8 [40];
  Level in_stack_ffffffffffffff50;
  char (*in_stack_ffffffffffffff60) [18];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  BlockManager *local_68;
  FlatFilePos *pFStack_60;
  char *pcStack_50;
  
  fReadOnly = (undefined1)((ulong)in_stack_fffffffffffffde8 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = (undefined4)in_RDI;
  source_line = (int)((ulong)in_RDI >> 0x20);
  CBlock::SetNull((CBlock *)in_stack_fffffffffffffda8);
  puVar7 = local_d8;
  OpenBlockFile((BlockManager *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                in_stack_fffffffffffffdf0,(bool)fReadOnly);
  uVar2 = AutoFile::IsNull((AutoFile *)in_stack_fffffffffffffda8);
  if ((bool)uVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdc8,
               in_stack_fffffffffffffdc0);
    uVar6 = (undefined4)((ulong)in_stack_fffffffffffffda8 >> 0x20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdc8,
               in_stack_fffffffffffffdc0);
    fmt = "%s: OpenBlockFile failed for %s\n";
    FlatFilePos::ToString_abi_cxx11_((FlatFilePos *)in_stack_fffffffffffffdb0);
    local_68 = (BlockManager *)CONCAT44(uVar6,4);
    logging_function._M_str = in_RSI;
    logging_function._M_len = in_RDX;
    LogPrintFormatInternal<char[18],std::__cxx11::string>
              (logging_function,in_stack_fffffffffffffe60,source_line,in_stack_fffffffffffffe10,
               in_stack_ffffffffffffff50,(ConstevalFormatString<2U>)fmt,in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
    local_171 = false;
  }
  else {
    PVar5 = TransactionSerParams::operator()
                      ((TransactionSerParams *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    flag = PVar5.m_params;
    AutoFile::operator>>
              (in_stack_fffffffffffffdb8,
               (ParamsWrapper<TransactionSerParams,_CBlock> *)in_stack_fffffffffffffdb0);
    CBlockHeader::GetHash(in_stack_fffffffffffffdc8);
    GetConsensus(in_stack_fffffffffffffda8);
    hash.super_base_blob<256U>.m_data._M_elems[8] = (char)uVar6;
    hash.super_base_blob<256U>.m_data._M_elems[9] = (char)((uint)uVar6 >> 8);
    hash.super_base_blob<256U>.m_data._M_elems[10] = (char)((uint)uVar6 >> 0x10);
    hash.super_base_blob<256U>.m_data._M_elems[0xb] = (char)((uint)uVar6 >> 0x18);
    hash.super_base_blob<256U>.m_data._M_elems._0_8_ = flag;
    hash.super_base_blob<256U>.m_data._M_elems[0xc] = (char)source_line;
    hash.super_base_blob<256U>.m_data._M_elems[0xd] = (char)((uint)source_line >> 8);
    hash.super_base_blob<256U>.m_data._M_elems[0xe] = (char)((uint)source_line >> 0x10);
    hash.super_base_blob<256U>.m_data._M_elems[0xf] = (char)((uint)source_line >> 0x18);
    hash.super_base_blob<256U>.m_data._M_elems._16_8_ = puVar7;
    hash.super_base_blob<256U>.m_data._M_elems[0x18] = (char)in_stack_fffffffffffffe28;
    hash.super_base_blob<256U>.m_data._M_elems[0x19] = (char)((uint7)in_stack_fffffffffffffe28 >> 8)
    ;
    hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
         (char)((uint7)in_stack_fffffffffffffe28 >> 0x10);
    hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
         (char)((uint7)in_stack_fffffffffffffe28 >> 0x18);
    hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
         (char)((uint7)in_stack_fffffffffffffe28 >> 0x20);
    hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
         (char)((uint7)in_stack_fffffffffffffe28 >> 0x28);
    hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
         (char)((uint7)in_stack_fffffffffffffe28 >> 0x30);
    hash.super_base_blob<256U>.m_data._M_elems[0x1f] = uVar2;
    bVar3 = CheckProofOfWork(hash,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd0);
    if (bVar3) {
      pPVar4 = GetConsensus(local_68);
      if ((pPVar4->signet_blocks & 1U) != 0) {
        GetConsensus(local_68);
        bVar3 = CheckSignetBlockSolution(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        if (!bVar3) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdc8,
                     pcStack_50);
          uVar6 = (undefined4)((ulong)local_68 >> 0x20);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdc8,
                     pcStack_50);
          FlatFilePos::ToString_abi_cxx11_(pFStack_60);
          local_68 = (BlockManager *)CONCAT44(uVar6,4);
          logging_function_01._M_str = in_RSI;
          logging_function_01._M_len = in_RDX;
          LogPrintFormatInternal<char[18],std::__cxx11::string>
                    (logging_function_01,in_stack_fffffffffffffe60,source_line,(LogFlags)flag,
                     in_stack_ffffffffffffff50,in_stack_fffffffffffffe58,in_stack_ffffffffffffff60,
                     in_stack_ffffffffffffff68);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
          local_171 = false;
          goto LAB_0037b790;
        }
      }
      local_171 = true;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdc8,
                 pcStack_50);
      uVar6 = (undefined4)((ulong)local_68 >> 0x20);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdc8,
                 pcStack_50);
      FlatFilePos::ToString_abi_cxx11_(pFStack_60);
      local_68 = (BlockManager *)CONCAT44(uVar6,4);
      logging_function_00._M_str = in_RSI;
      logging_function_00._M_len = in_RDX;
      LogPrintFormatInternal<char[18],std::__cxx11::string>
                (logging_function_00,in_stack_fffffffffffffe60,source_line,(LogFlags)flag,
                 in_stack_ffffffffffffff50,in_stack_fffffffffffffe58,in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff68);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
      local_171 = false;
    }
  }
LAB_0037b790:
  AutoFile::~AutoFile((AutoFile *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_171;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::ReadBlockFromDisk(CBlock& block, const FlatFilePos& pos) const
{
    block.SetNull();

    // Open history file to read
    AutoFile filein{OpenBlockFile(pos, true)};
    if (filein.IsNull()) {
        LogError("%s: OpenBlockFile failed for %s\n", __func__, pos.ToString());
        return false;
    }

    // Read block
    try {
        filein >> TX_WITH_WITNESS(block);
    } catch (const std::exception& e) {
        LogError("%s: Deserialize or I/O error - %s at %s\n", __func__, e.what(), pos.ToString());
        return false;
    }

    // Check the header
    if (!CheckProofOfWork(block.GetHash(), block.nBits, GetConsensus())) {
        LogError("%s: Errors in block header at %s\n", __func__, pos.ToString());
        return false;
    }

    // Signet only: check block solution
    if (GetConsensus().signet_blocks && !CheckSignetBlockSolution(block, GetConsensus())) {
        LogError("%s: Errors in block solution at %s\n", __func__, pos.ToString());
        return false;
    }

    return true;
}